

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::CMStateSet::CMStateSet(CMStateSet *this,XMLSize_t bitCount,MemoryManager *manager)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong local_48;
  XMLSize_t index_1;
  XMLSize_t index;
  OutOfMemoryException *anon_var_0;
  MemoryManager *manager_local;
  XMLSize_t bitCount_local;
  CMStateSet *this_local;
  
  XMemory::XMemory((XMemory *)this);
  this->fBitCount = bitCount;
  this->fDynamicBuffer = (CMDynamicBuffer *)0x0;
  if (this->fBitCount < 0x81) {
    for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
      this->fBits[local_48] = 0;
    }
  }
  else {
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,0x18);
    this->fDynamicBuffer = (CMDynamicBuffer *)CONCAT44(extraout_var,iVar2);
    this->fDynamicBuffer->fMemoryManager = manager;
    this->fDynamicBuffer->fArraySize = this->fBitCount >> 10;
    if ((this->fBitCount & 0x3ff) != 0) {
      this->fDynamicBuffer->fArraySize = this->fDynamicBuffer->fArraySize + 1;
    }
    pMVar1 = this->fDynamicBuffer->fMemoryManager;
    iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,this->fDynamicBuffer->fArraySize << 3);
    this->fDynamicBuffer->fBitArray = (XMLInt32 **)CONCAT44(extraout_var_00,iVar2);
    for (index_1 = 0; index_1 < this->fDynamicBuffer->fArraySize; index_1 = index_1 + 1) {
      this->fDynamicBuffer->fBitArray[index_1] = (XMLInt32 *)0x0;
    }
  }
  return;
}

Assistant:

CMStateSet( const XMLSize_t bitCount
              , MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager) :

        fBitCount(bitCount)
        , fDynamicBuffer(0)
    {
        //
        //  See if we need to allocate the byte array or whether we can live
        //  within the cached bit high performance scheme.
        //
        if (fBitCount > (CMSTATE_CACHED_INT32_SIZE * 32))
        {
            fDynamicBuffer = (CMDynamicBuffer*)manager->allocate(sizeof(CMDynamicBuffer));
            fDynamicBuffer->fMemoryManager = manager;
            // allocate an array of vectors, each one containing CMSTATE_BITFIELD_CHUNK bits
            fDynamicBuffer->fArraySize = fBitCount / CMSTATE_BITFIELD_CHUNK;
            if (fBitCount % CMSTATE_BITFIELD_CHUNK)
                fDynamicBuffer->fArraySize++;
            try
            {
                fDynamicBuffer->fBitArray = (XMLInt32**) fDynamicBuffer->fMemoryManager->allocate(fDynamicBuffer->fArraySize*sizeof(XMLInt32*));
            }
            catch( const OutOfMemoryException& )
            {
                fDynamicBuffer->fMemoryManager->deallocate(fDynamicBuffer);
                throw;
            }
            for(XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
                fDynamicBuffer->fBitArray[index]=NULL;
        }
        else
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                fBits[index] = 0;
        }
    }